

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O0

void fe_create_twiddle(fe_t *fe)

{
  double dVar1;
  double dVar2;
  float64 a;
  int i;
  fe_t *fe_local;
  
  for (a._4_4_ = 0; a._4_4_ < (int)fe->fft_size / 4; a._4_4_ = a._4_4_ + 1) {
    dVar1 = ((double)a._4_4_ * 6.283185307179586) / (double)(int)fe->fft_size;
    dVar2 = cos(dVar1);
    fe->ccc[a._4_4_] = (frame_t)dVar2;
    dVar1 = sin(dVar1);
    fe->sss[a._4_4_] = (frame_t)dVar1;
  }
  return;
}

Assistant:

void
fe_create_twiddle(fe_t * fe)
{
    int i;

    for (i = 0; i < fe->fft_size / 4; ++i) {
        float64 a = 2 * M_PI * i / fe->fft_size;
#ifdef FIXED16
        fe->ccc[i] = (int16)(cos(a) * 0x8000);
        fe->sss[i] = (int16)(sin(a) * 0x8000);
#elif defined(FIXED_POINT)
        fe->ccc[i] = FLOAT2COS(cos(a));
        fe->sss[i] = FLOAT2COS(sin(a));
#else
        fe->ccc[i] = cos(a);
        fe->sss[i] = sin(a);
#endif
    }
}